

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CaseStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ExpressionSyntax *args_5,Token *args_6,Token *args_7,
          SyntaxList<slang::syntax::CaseItemSyntax> *args_8,Token *args_9)

{
  Token uniqueOrPriority;
  Token caseKeyword;
  Token openParen;
  Token closeParen;
  Token matchesOrInside;
  Token endcase;
  CaseStatementSyntax *this_00;
  
  this_00 = (CaseStatementSyntax *)allocate(this,0xf8,8);
  uniqueOrPriority.kind = args_2->kind;
  uniqueOrPriority._2_1_ = args_2->field_0x2;
  uniqueOrPriority.numFlags.raw = (args_2->numFlags).raw;
  uniqueOrPriority.rawLen = args_2->rawLen;
  uniqueOrPriority.info = args_2->info;
  endcase.kind = args_9->kind;
  endcase._2_1_ = args_9->field_0x2;
  endcase.numFlags.raw = (args_9->numFlags).raw;
  endcase.rawLen = args_9->rawLen;
  endcase.info = args_9->info;
  matchesOrInside.kind = args_7->kind;
  matchesOrInside._2_1_ = args_7->field_0x2;
  matchesOrInside.numFlags.raw = (args_7->numFlags).raw;
  matchesOrInside.rawLen = args_7->rawLen;
  matchesOrInside.info = args_7->info;
  closeParen.kind = args_6->kind;
  closeParen._2_1_ = args_6->field_0x2;
  closeParen.numFlags.raw = (args_6->numFlags).raw;
  closeParen.rawLen = args_6->rawLen;
  closeParen.info = args_6->info;
  openParen.kind = args_4->kind;
  openParen._2_1_ = args_4->field_0x2;
  openParen.numFlags.raw = (args_4->numFlags).raw;
  openParen.rawLen = args_4->rawLen;
  openParen.info = args_4->info;
  caseKeyword.kind = args_3->kind;
  caseKeyword._2_1_ = args_3->field_0x2;
  caseKeyword.numFlags.raw = (args_3->numFlags).raw;
  caseKeyword.rawLen = args_3->rawLen;
  caseKeyword.info = args_3->info;
  slang::syntax::CaseStatementSyntax::CaseStatementSyntax
            (this_00,*args,args_1,uniqueOrPriority,caseKeyword,openParen,args_5,closeParen,
             matchesOrInside,args_8,endcase);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }